

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::ReflectionSchema::IsSplit(ReflectionSchema *this,FieldDescriptor *field)

{
  FieldDescriptor **ppFVar1;
  
  if (this->split_offset_ != -1) {
    if ((field->field_0x1 & 8) == 0) {
      ppFVar1 = &field->containing_type_->fields_;
    }
    else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
      ppFVar1 = &field->file_->extensions_;
    }
    else {
      ppFVar1 = &((field->scope_).extension_scope)->extensions_;
    }
    return SUB41(this->offsets_[(int)((ulong)((long)field - (long)*ppFVar1) >> 3) * -0x45d1745d] >>
                 0x1f,0);
  }
  return false;
}

Assistant:

bool IsSplit(const FieldDescriptor* field) const {
    return split_offset_ != -1 &&
           (offsets_[field->index()] & kSplitFieldOffsetMask) != 0;
  }